

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O1

void __thiscall SemanticTables::visit(SemanticTables *this,IdListNode *idListNode)

{
  TokenNode *pTVar1;
  ArrayNode *pAVar2;
  IdListNode *pIVar3;
  
  pTVar1 = idListNode->id;
  if (pTVar1 != (TokenNode *)0x0) {
    (*(pTVar1->super_ExpNode).super_StmtNode.super_ASTNode._vptr_ASTNode[3])(pTVar1,this);
    (idListNode->id->super_ExpNode).pointer = idListNode->pointer != (PointerNode *)0x0;
    pAVar2 = idListNode->array;
    if (pAVar2 != (ArrayNode *)0x0) {
      (*(pAVar2->super_ExpNode).super_StmtNode.super_ASTNode._vptr_ASTNode[3])(pAVar2,this);
      (idListNode->id->super_ExpNode).arraySize = (idListNode->array->super_ExpNode).arraySize;
    }
  }
  pIVar3 = idListNode->next;
  if (pIVar3 != (IdListNode *)0x0) {
    (*(pIVar3->super_ASTNode)._vptr_ASTNode[3])(pIVar3,this);
  }
  pAVar2 = idListNode->array;
  if (pAVar2 != (ArrayNode *)0x0) {
    (*(pAVar2->super_ExpNode).super_StmtNode.super_ASTNode._vptr_ASTNode[3])(pAVar2,this);
    return;
  }
  return;
}

Assistant:

void SemanticTables::visit(IdListNode *idListNode) {
    if (idListNode->getId() != NULL) {
        idListNode->getId()->accept(this);
        idListNode->getId()->setPointer(idListNode->getPointer() != NULL);
        if (idListNode->getArray() != NULL) {
            idListNode->getArray()->accept(this);
            idListNode->getId()->setArraySize(idListNode->getArray()->getArraySize());
        }
    }
    if (idListNode->getNext() != NULL) {
        idListNode->getNext()->accept(this);
    }
    if (idListNode->getArray() != NULL) {
        idListNode->getArray()->accept(this);
    }
    TypeNode *typeNode = new TypeNode(idListNode->getId(), idListNode->getId()->getTypeLexeme());
    typeNode->setLine(idListNode->getLine());


}